

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highlighting.cpp
# Opt level: O0

vector<duckdb::highlightToken,_true> * duckdb::GetParseTokens(char *buf,size_t len)

{
  bool bVar1;
  reference pSVar2;
  reference pvVar3;
  long lVar4;
  ulong in_RDX;
  char *in_RSI;
  vector<duckdb::highlightToken,_true> *in_RDI;
  highlightToken new_token_2;
  highlightToken new_token_1;
  highlightToken new_token;
  SimplifiedToken *token;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::SimplifiedToken,_true> *__range1;
  vector<duckdb::SimplifiedToken,_true> parseTokens;
  string sql;
  vector<duckdb::highlightToken,_true> *tokens;
  vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>
  *in_stack_fffffffffffffeb8;
  vector<duckdb::highlightToken,_true> *in_stack_fffffffffffffec0;
  highlightToken *in_stack_fffffffffffffec8;
  iterator in_stack_fffffffffffffed0;
  highlightToken local_f0;
  highlightToken *local_d8;
  highlightToken *local_d0;
  highlightToken local_c0;
  tokenType in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff59;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *in_stack_ffffffffffffff60
  ;
  const_iterator in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff78;
  __normal_iterator<duckdb::SimplifiedToken_*,_std::vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>_>
  local_80;
  undefined1 *local_78;
  undefined1 local_69;
  undefined1 local_68 [47];
  allocator local_39;
  string local_38 [56];
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_38,in_RSI,in_RDX,&local_39);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  Parser::Tokenize(in_stack_ffffffffffffff78);
  local_69 = 0;
  vector<duckdb::highlightToken,_true>::vector((vector<duckdb::highlightToken,_true> *)0x1f39fc);
  local_78 = local_68;
  local_80._M_current =
       (SimplifiedToken *)
       ::std::vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>::begin
                 (in_stack_fffffffffffffeb8);
  ::std::vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>::end
            (in_stack_fffffffffffffeb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::SimplifiedToken_*,_std::vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>_>
                             *)in_stack_fffffffffffffec0,
                            (__normal_iterator<duckdb::SimplifiedToken_*,_std::vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>_>
                             *)in_stack_fffffffffffffeb8), bVar1) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<duckdb::SimplifiedToken_*,_std::vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>_>
             ::operator*(&local_80);
    highlightToken::highlightToken((highlightToken *)&stack0xffffffffffffff58);
    in_stack_ffffffffffffff58 = convertToken((SimplifiedTokenType)(in_RDX >> 0x30));
    in_stack_ffffffffffffff60 =
         (vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)pSVar2->start;
    ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
              ((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
               in_stack_fffffffffffffed0._M_current,in_stack_fffffffffffffec8);
    __gnu_cxx::
    __normal_iterator<duckdb::SimplifiedToken_*,_std::vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>_>
    ::operator++(&local_80);
  }
  bVar1 = ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::empty
                    ((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                     in_stack_fffffffffffffed0._M_current);
  if ((!bVar1) &&
     (pvVar3 = vector<duckdb::highlightToken,_true>::operator[]
                         (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8),
     pvVar3->start != 0)) {
    in_stack_fffffffffffffec8 = &local_c0;
    highlightToken::highlightToken(in_stack_fffffffffffffec8);
    local_c0.type = TOKEN_IDENTIFIER;
    local_c0.start = 0;
    local_d0 = (highlightToken *)
               ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::begin
                         ((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *
                          )in_stack_fffffffffffffeb8);
    __gnu_cxx::
    __normal_iterator<duckdb::highlightToken_const*,std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>>
    ::__normal_iterator<duckdb::highlightToken*>
              ((__normal_iterator<const_duckdb::highlightToken_*,_std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>_>
                *)in_stack_fffffffffffffec0,
               (__normal_iterator<duckdb::highlightToken_*,_std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>_>
                *)in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffed0 =
         ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::insert
                   (in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
                    (value_type *)CONCAT71(in_stack_ffffffffffffff59,in_stack_ffffffffffffff58));
    local_d8 = in_stack_fffffffffffffed0._M_current;
  }
  bVar1 = ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::empty
                    ((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                     in_stack_fffffffffffffed0._M_current);
  if ((bVar1) && (lVar4 = ::std::__cxx11::string::size(), lVar4 != 0)) {
    highlightToken::highlightToken(&local_f0);
    local_f0.type = TOKEN_IDENTIFIER;
    local_f0.start = 0;
    ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
              ((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
               in_stack_fffffffffffffed0._M_current,in_stack_fffffffffffffec8);
  }
  local_69 = 1;
  vector<duckdb::SimplifiedToken,_true>::~vector((vector<duckdb::SimplifiedToken,_true> *)0x1f3c60);
  ::std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

vector<highlightToken> GetParseTokens(char *buf, size_t len) {
	string sql(buf, len);
	auto parseTokens = duckdb::Parser::Tokenize(sql);

	vector<highlightToken> tokens;
	for (auto &token : parseTokens) {
		highlightToken new_token;
		new_token.type = convertToken(token.type);
		new_token.start = token.start;
		tokens.push_back(new_token);
	}

	if (!tokens.empty() && tokens[0].start > 0) {
		highlightToken new_token;
		new_token.type = tokenType::TOKEN_IDENTIFIER;
		new_token.start = 0;
		tokens.insert(tokens.begin(), new_token);
	}
	if (tokens.empty() && sql.size() > 0) {
		highlightToken new_token;
		new_token.type = tokenType::TOKEN_IDENTIFIER;
		new_token.start = 0;
		tokens.push_back(new_token);
	}
	return tokens;
}